

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ZSTD_compressionParameters *cParams_00;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  seqDef *psVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  BYTE *pStart;
  ulong uVar13;
  ulong *puVar14;
  ulong *puVar15;
  int iVar16;
  ulong *puVar17;
  BYTE *pBVar18;
  ulong *puVar19;
  uint uVar20;
  BYTE *pStart_2;
  int iVar21;
  uint uVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  ulong uVar25;
  ulong *puVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong *puVar32;
  BYTE *pBVar33;
  long lVar34;
  uint uVar35;
  U32 UVar36;
  ulong uVar37;
  BYTE *pBVar38;
  ulong *puVar39;
  BYTE *pInLoopLimit;
  ZSTD_compressionParameters *cParams;
  BYTE *local_a0;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar32 = (ulong *)((long)src + (srcSize - 8));
  pBVar33 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar39 = (ulong *)((ulong)((int)src == (int)pBVar33) + (long)src);
  uVar20 = (int)puVar39 - (int)pBVar33;
  uVar29 = (ulong)uVar5;
  if (uVar20 < uVar5) {
    uVar29 = 0;
  }
  uVar27 = (uint)uVar29;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar13 = (ulong)uVar6;
  if (uVar20 < uVar6) {
    uVar13 = 0;
  }
  uVar12 = (uint)uVar13;
  if (puVar39 < puVar32) {
    puVar1 = (ulong *)((long)puVar4 - 7);
    puVar2 = (ulong *)((long)puVar4 - 3);
    puVar3 = (ulong *)((long)puVar4 - 1);
    cParams_00 = &ms->cParams;
    do {
      iVar21 = (int)uVar13;
      lVar34 = -uVar13;
      if (iVar21 == 0) {
        pBVar38 = (BYTE *)0x0;
      }
      else {
        pBVar38 = (BYTE *)0x0;
        if (*(int *)(((long)puVar39 + 1) - uVar13) == *(int *)((long)puVar39 + 1)) {
          puVar26 = (ulong *)((long)puVar39 + 5);
          puVar14 = (ulong *)((long)puVar39 + lVar34 + 5);
          puVar19 = puVar26;
          if (puVar26 < puVar1) {
            uVar25 = *puVar26 ^ *puVar14;
            uVar37 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
              }
            }
            pBVar38 = (BYTE *)(uVar37 >> 3 & 0x1fffffff);
            if (*puVar14 == *puVar26) {
              puVar19 = (ulong *)((long)puVar39 + 0xd);
              puVar14 = (ulong *)((long)puVar39 + lVar34 + 0xd);
              do {
                if (puVar1 <= puVar19) goto LAB_00460ff7;
                uVar37 = *puVar14;
                uVar25 = *puVar19;
                uVar28 = uVar25 ^ uVar37;
                uVar30 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                pBVar38 = (BYTE *)((long)puVar19 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar26));
                puVar19 = puVar19 + 1;
                puVar14 = puVar14 + 1;
              } while (uVar37 == uVar25);
            }
          }
          else {
LAB_00460ff7:
            if ((puVar19 < puVar2) && ((int)*puVar14 == (int)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 4);
              puVar14 = (ulong *)((long)puVar14 + 4);
            }
            if ((puVar19 < puVar3) && ((short)*puVar14 == (short)*puVar19)) {
              puVar19 = (ulong *)((long)puVar19 + 2);
              puVar14 = (ulong *)((long)puVar14 + 2);
            }
            if (puVar19 < puVar4) {
              puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar19));
            }
            pBVar38 = (BYTE *)((long)puVar19 - (long)puVar26);
          }
          pBVar38 = pBVar38 + 4;
        }
      }
      uVar27 = (ms->cParams).minMatch;
      iVar16 = (int)puVar39;
      if (uVar27 - 6 < 2) {
        pUVar8 = ms->chainTable;
        uVar22 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar35 = iVar16 - (int)pBVar18;
        uVar12 = uVar35 - uVar22;
        if (uVar35 < uVar22) {
          uVar12 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar39,6);
        if (uVar11 <= uVar27) goto LAB_00461570;
        iVar16 = 1 << ((byte)uVar7 & 0x1f);
        uVar37 = 999999999;
        pBVar23 = (BYTE *)0x3;
        do {
          puVar26 = (ulong *)(pBVar18 + uVar11);
          if (pBVar23[(long)puVar26] == *(BYTE *)((long)puVar39 + (long)pBVar23)) {
            puVar19 = puVar39;
            if (puVar39 < puVar1) {
              uVar30 = *puVar39 ^ *puVar26;
              uVar25 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              pBVar24 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
              if (*puVar26 == *puVar39) {
                do {
                  puVar19 = puVar19 + 1;
                  puVar26 = puVar26 + 1;
                  if (puVar1 <= puVar19) goto LAB_0046117e;
                  uVar30 = *puVar19 ^ *puVar26;
                  uVar25 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)((long)puVar19 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar39));
                } while (*puVar26 == *puVar19);
              }
            }
            else {
LAB_0046117e:
              if ((puVar19 < puVar2) && ((int)*puVar26 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar26 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar19 < puVar4) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar19));
              }
              pBVar24 = (BYTE *)((long)puVar19 - (long)puVar39);
            }
          }
          else {
            pBVar24 = (BYTE *)0x0;
          }
          if ((pBVar23 < pBVar24) &&
             (uVar37 = (ulong)((uVar35 + 2) - uVar11), pBVar23 = pBVar24,
             (ulong *)((long)puVar39 + (long)pBVar24) == puVar4)) {
            bVar10 = false;
          }
          else {
            pBVar24 = pBVar23;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar22 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar27 < uVar11)) &&
                (iVar16 = iVar16 + -1, pBVar23 = pBVar24, iVar16 != 0));
      }
      else if (uVar27 == 5) {
        pUVar8 = ms->chainTable;
        uVar22 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar35 = iVar16 - (int)pBVar18;
        uVar12 = uVar35 - uVar22;
        if (uVar35 < uVar22) {
          uVar12 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar39,5);
        if (uVar27 < uVar11) {
          iVar16 = 1 << ((byte)uVar7 & 0x1f);
          uVar37 = 999999999;
          pBVar23 = (BYTE *)0x3;
          do {
            puVar26 = (ulong *)(pBVar18 + uVar11);
            if (pBVar23[(long)puVar26] == *(BYTE *)((long)puVar39 + (long)pBVar23)) {
              puVar19 = puVar39;
              if (puVar39 < puVar1) {
                uVar30 = *puVar39 ^ *puVar26;
                uVar25 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                pBVar24 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                if (*puVar26 == *puVar39) {
                  do {
                    puVar19 = puVar19 + 1;
                    puVar26 = puVar26 + 1;
                    if (puVar1 <= puVar19) goto LAB_00461331;
                    uVar30 = *puVar19 ^ *puVar26;
                    uVar25 = 0;
                    if (uVar30 != 0) {
                      for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)((long)puVar19 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar39))
                    ;
                  } while (*puVar26 == *puVar19);
                }
              }
              else {
LAB_00461331:
                if ((puVar19 < puVar2) && ((int)*puVar26 == (int)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar26 = (ulong *)((long)puVar26 + 4);
                }
                if ((puVar19 < puVar3) && ((short)*puVar26 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar26 = (ulong *)((long)puVar26 + 2);
                }
                if (puVar19 < puVar4) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar19));
                }
                pBVar24 = (BYTE *)((long)puVar19 - (long)puVar39);
              }
            }
            else {
              pBVar24 = (BYTE *)0x0;
            }
            if ((pBVar23 < pBVar24) &&
               (uVar37 = (ulong)((uVar35 + 2) - uVar11), pBVar23 = pBVar24,
               (ulong *)((long)puVar39 + (long)pBVar24) == puVar4)) {
              bVar10 = false;
            }
            else {
              pBVar24 = pBVar23;
              if (uVar12 < uVar11) {
                uVar11 = pUVar8[uVar11 & uVar22 - 1];
                bVar10 = true;
              }
              else {
                bVar10 = false;
              }
            }
          } while (((bVar10) && (uVar27 < uVar11)) &&
                  (iVar16 = iVar16 + -1, pBVar23 = pBVar24, iVar16 != 0));
        }
        else {
LAB_00461570:
          pBVar24 = (BYTE *)0x3;
          uVar37 = 999999999;
        }
      }
      else {
        pUVar8 = ms->chainTable;
        uVar22 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
        pBVar18 = (ms->window).base;
        uVar27 = (ms->window).lowLimit;
        uVar35 = iVar16 - (int)pBVar18;
        uVar12 = uVar35 - uVar22;
        if (uVar35 < uVar22) {
          uVar12 = 0;
        }
        uVar7 = (ms->cParams).searchLog;
        uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar39,4);
        if (uVar11 <= uVar27) goto LAB_00461570;
        iVar16 = 1 << ((byte)uVar7 & 0x1f);
        uVar37 = 999999999;
        pBVar23 = (BYTE *)0x3;
        do {
          puVar26 = (ulong *)(pBVar18 + uVar11);
          if (pBVar23[(long)puVar26] == *(BYTE *)((long)puVar39 + (long)pBVar23)) {
            puVar19 = puVar39;
            if (puVar39 < puVar1) {
              uVar30 = *puVar39 ^ *puVar26;
              uVar25 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              pBVar24 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
              if (*puVar26 == *puVar39) {
                do {
                  puVar19 = puVar19 + 1;
                  puVar26 = puVar26 + 1;
                  if (puVar1 <= puVar19) goto LAB_004614db;
                  uVar30 = *puVar19 ^ *puVar26;
                  uVar25 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)((long)puVar19 + ((uVar25 >> 3 & 0x1fffffff) - (long)puVar39));
                } while (*puVar26 == *puVar19);
              }
            }
            else {
LAB_004614db:
              if ((puVar19 < puVar2) && ((int)*puVar26 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar26 = (ulong *)((long)puVar26 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar26 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar26 = (ulong *)((long)puVar26 + 2);
              }
              if (puVar19 < puVar4) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar26 == (BYTE)*puVar19));
              }
              pBVar24 = (BYTE *)((long)puVar19 - (long)puVar39);
            }
          }
          else {
            pBVar24 = (BYTE *)0x0;
          }
          if ((pBVar23 < pBVar24) &&
             (uVar37 = (ulong)((uVar35 + 2) - uVar11), pBVar23 = pBVar24,
             (ulong *)((long)puVar39 + (long)pBVar24) == puVar4)) {
            bVar10 = false;
          }
          else {
            pBVar24 = pBVar23;
            if (uVar12 < uVar11) {
              uVar11 = pUVar8[uVar11 & uVar22 - 1];
              bVar10 = true;
            }
            else {
              bVar10 = false;
            }
          }
        } while (((bVar10) && (uVar27 < uVar11)) &&
                (iVar16 = iVar16 + -1, pBVar23 = pBVar24, iVar16 != 0));
      }
      local_a0 = pBVar38;
      if (pBVar38 < pBVar24) {
        local_a0 = pBVar24;
      }
      if (local_a0 < (BYTE *)0x4) {
        puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
      }
      else {
        puVar26 = puVar39;
        if (pBVar24 <= pBVar38) {
          uVar37 = 0;
          puVar39 = (ulong *)((long)puVar39 + 1);
        }
        do {
          do {
            puVar19 = puVar26;
            if (puVar32 <= puVar19) goto LAB_0046236d;
            puVar26 = (ulong *)((long)puVar19 + 1);
            if (((uVar37 != 0) && (iVar21 != 0)) &&
               (*(int *)puVar26 == *(int *)((long)puVar26 + lVar34))) {
              puVar14 = (ulong *)((long)puVar19 + 5);
              puVar15 = (ulong *)((long)puVar19 + lVar34 + 5);
              puVar17 = puVar14;
              if (puVar14 < puVar1) {
                uVar30 = *puVar14 ^ *puVar15;
                uVar25 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                  }
                }
                pBVar38 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
                if (*puVar15 == *puVar14) {
                  puVar17 = (ulong *)((long)puVar19 + 0xd);
                  puVar15 = (ulong *)((long)puVar19 + lVar34 + 0xd);
                  do {
                    if (puVar1 <= puVar17) goto LAB_00461692;
                    uVar25 = *puVar15;
                    uVar30 = *puVar17;
                    uVar31 = uVar30 ^ uVar25;
                    uVar28 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                      }
                    }
                    pBVar38 = (BYTE *)((long)puVar17 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar14))
                    ;
                    puVar17 = puVar17 + 1;
                    puVar15 = puVar15 + 1;
                  } while (uVar25 == uVar30);
                }
              }
              else {
LAB_00461692:
                if ((puVar17 < puVar2) && ((int)*puVar15 == (int)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 4);
                  puVar15 = (ulong *)((long)puVar15 + 4);
                }
                if ((puVar17 < puVar3) && ((short)*puVar15 == (short)*puVar17)) {
                  puVar17 = (ulong *)((long)puVar17 + 2);
                  puVar15 = (ulong *)((long)puVar15 + 2);
                }
                if (puVar17 < puVar4) {
                  puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar17));
                }
                pBVar38 = (BYTE *)((long)puVar17 - (long)puVar14);
              }
              if (pBVar38 < (BYTE *)0xfffffffffffffffc) {
                uVar12 = (int)uVar37 + 1;
                uVar27 = 0x1f;
                if (uVar12 != 0) {
                  for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                  }
                }
                if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 3 + -0x1e) < (int)(pBVar38 + 4) * 3) {
                  uVar37 = 0;
                  puVar39 = puVar26;
                  local_a0 = pBVar38 + 4;
                }
              }
            }
            uVar27 = (ms->cParams).minMatch;
            iVar16 = (int)puVar26;
            if (uVar27 - 6 < 2) {
              pUVar8 = ms->chainTable;
              uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar38 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar22 = iVar16 - (int)pBVar38;
              uVar12 = uVar22 - uVar35;
              if (uVar22 < uVar35) {
                uVar12 = 0;
              }
              uVar7 = (ms->cParams).searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,6);
              if (uVar11 <= uVar27) goto LAB_00461c35;
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar25 = 999999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar38 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                  puVar17 = puVar26;
                  if (puVar26 < puVar1) {
                    uVar28 = *puVar26 ^ *puVar14;
                    uVar30 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 9);
                    if (*puVar14 == *puVar26) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_00461834;
                        uVar30 = *puVar17;
                        uVar31 = uVar30 ^ *puVar14;
                        uVar28 = 0;
                        if (uVar31 != 0) {
                          for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar23 = (BYTE *)((long)puVar17 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar30);
                    }
                  }
                  else {
LAB_00461834:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                  }
                }
                else {
                  pBVar23 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar23) &&
                   (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                   (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar23 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar35 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
            }
            else if (uVar27 == 5) {
              pUVar8 = ms->chainTable;
              uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar38 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar22 = iVar16 - (int)pBVar38;
              uVar12 = uVar22 - uVar35;
              if (uVar22 < uVar35) {
                uVar12 = 0;
              }
              uVar7 = (ms->cParams).searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,5);
              if (uVar27 < uVar11) {
                iVar16 = 1 << ((byte)uVar7 & 0x1f);
                uVar25 = 999999999;
                pBVar18 = (BYTE *)0x3;
                do {
                  puVar14 = (ulong *)(pBVar38 + uVar11);
                  if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                    puVar17 = puVar26;
                    if (puVar26 < puVar1) {
                      uVar28 = *puVar26 ^ *puVar14;
                      uVar30 = 0;
                      if (uVar28 != 0) {
                        for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                      puVar17 = (ulong *)((long)puVar19 + 9);
                      if (*puVar14 == *puVar26) {
                        do {
                          puVar14 = puVar14 + 1;
                          if (puVar1 <= puVar17) goto LAB_004619ed;
                          uVar30 = *puVar17;
                          uVar31 = uVar30 ^ *puVar14;
                          uVar28 = 0;
                          if (uVar31 != 0) {
                            for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                            }
                          }
                          pBVar23 = (BYTE *)((long)puVar17 +
                                            ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                          puVar17 = puVar17 + 1;
                        } while (*puVar14 == uVar30);
                      }
                    }
                    else {
LAB_004619ed:
                      if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                        puVar17 = (ulong *)((long)puVar17 + 4);
                        puVar14 = (ulong *)((long)puVar14 + 4);
                      }
                      if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                        puVar17 = (ulong *)((long)puVar17 + 2);
                        puVar14 = (ulong *)((long)puVar14 + 2);
                      }
                      if (puVar17 < puVar4) {
                        puVar17 = (ulong *)((long)puVar17 +
                                           (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                      }
                      pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                    }
                  }
                  else {
                    pBVar23 = (BYTE *)0x0;
                  }
                  if ((pBVar18 < pBVar23) &&
                     (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                     (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                    bVar10 = false;
                  }
                  else {
                    pBVar23 = pBVar18;
                    if (uVar12 < uVar11) {
                      uVar11 = pUVar8[uVar11 & uVar35 - 1];
                      bVar10 = true;
                    }
                    else {
                      bVar10 = false;
                    }
                  }
                } while (((bVar10) && (uVar27 < uVar11)) &&
                        (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
              }
              else {
LAB_00461c35:
                pBVar23 = (BYTE *)0x3;
                uVar25 = 999999999;
              }
            }
            else {
              pUVar8 = ms->chainTable;
              uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
              pBVar38 = (ms->window).base;
              uVar27 = (ms->window).lowLimit;
              uVar22 = iVar16 - (int)pBVar38;
              uVar12 = uVar22 - uVar35;
              if (uVar22 < uVar35) {
                uVar12 = 0;
              }
              uVar7 = (ms->cParams).searchLog;
              uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,4);
              if (uVar11 <= uVar27) goto LAB_00461c35;
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar25 = 999999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar38 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                  puVar17 = puVar26;
                  if (puVar26 < puVar1) {
                    uVar28 = *puVar26 ^ *puVar14;
                    uVar30 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 9);
                    if (*puVar14 == *puVar26) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_00461b9c;
                        uVar30 = *puVar17;
                        uVar31 = uVar30 ^ *puVar14;
                        uVar28 = 0;
                        if (uVar31 != 0) {
                          for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar23 = (BYTE *)((long)puVar17 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar30);
                    }
                  }
                  else {
LAB_00461b9c:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                  }
                }
                else {
                  pBVar23 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar23) &&
                   (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                   (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar23 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar35 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
            }
            bVar10 = true;
            if ((BYTE *)0x3 < pBVar23) {
              uVar12 = (int)uVar37 + 1;
              uVar27 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              uVar12 = (int)uVar25 + 1;
              iVar16 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x1b) < (int)pBVar23 * 4 - iVar16) {
                bVar10 = false;
                puVar39 = puVar26;
                uVar37 = uVar25;
                local_a0 = pBVar23;
              }
            }
          } while (!bVar10);
          if (puVar32 <= puVar26) break;
          puVar26 = (ulong *)((long)puVar19 + 2);
          if (((uVar37 != 0) && (iVar21 != 0)) &&
             (*(int *)puVar26 == *(int *)((long)puVar26 + lVar34))) {
            puVar14 = (ulong *)((long)puVar19 + 6);
            puVar15 = (ulong *)((long)puVar19 + lVar34 + 6);
            puVar17 = puVar14;
            if (puVar14 < puVar1) {
              uVar30 = *puVar14 ^ *puVar15;
              uVar25 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              pBVar38 = (BYTE *)(uVar25 >> 3 & 0x1fffffff);
              if (*puVar15 == *puVar14) {
                puVar17 = (ulong *)((long)puVar19 + 0xe);
                puVar15 = (ulong *)((long)puVar19 + lVar34 + 0xe);
                do {
                  if (puVar1 <= puVar17) goto LAB_00461d66;
                  uVar25 = *puVar15;
                  uVar30 = *puVar17;
                  uVar31 = uVar30 ^ uVar25;
                  uVar28 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                    }
                  }
                  pBVar38 = (BYTE *)((long)puVar17 + ((uVar28 >> 3 & 0x1fffffff) - (long)puVar14));
                  puVar17 = puVar17 + 1;
                  puVar15 = puVar15 + 1;
                } while (uVar25 == uVar30);
              }
            }
            else {
LAB_00461d66:
              if ((puVar17 < puVar2) && ((int)*puVar15 == (int)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 4);
                puVar15 = (ulong *)((long)puVar15 + 4);
              }
              if ((puVar17 < puVar3) && ((short)*puVar15 == (short)*puVar17)) {
                puVar17 = (ulong *)((long)puVar17 + 2);
                puVar15 = (ulong *)((long)puVar15 + 2);
              }
              if (puVar17 < puVar4) {
                puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar15 == (BYTE)*puVar17));
              }
              pBVar38 = (BYTE *)((long)puVar17 - (long)puVar14);
            }
            if (pBVar38 < (BYTE *)0xfffffffffffffffc) {
              uVar12 = (int)uVar37 + 1;
              uVar27 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x1e) < (int)(pBVar38 + 4) * 4) {
                uVar37 = 0;
                puVar39 = puVar26;
                local_a0 = pBVar38 + 4;
              }
            }
          }
          uVar27 = (ms->cParams).minMatch;
          iVar16 = (int)puVar26;
          if (uVar27 - 6 < 2) {
            pUVar8 = ms->chainTable;
            uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar38 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar22 = iVar16 - (int)pBVar38;
            uVar12 = uVar22 - uVar35;
            if (uVar22 < uVar35) {
              uVar12 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,6);
            if (uVar11 <= uVar27) goto LAB_004622eb;
            iVar16 = 1 << ((byte)uVar7 & 0x1f);
            uVar25 = 999999999;
            pBVar18 = (BYTE *)0x3;
            do {
              puVar14 = (ulong *)(pBVar38 + uVar11);
              if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                puVar17 = puVar26;
                if (puVar26 < puVar1) {
                  uVar28 = *puVar26 ^ *puVar14;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                  puVar17 = (ulong *)((long)puVar19 + 10);
                  if (*puVar14 == *puVar26) {
                    do {
                      puVar14 = puVar14 + 1;
                      if (puVar1 <= puVar17) goto LAB_00461f03;
                      uVar30 = *puVar17;
                      uVar31 = uVar30 ^ *puVar14;
                      uVar28 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar23 = (BYTE *)((long)puVar17 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                      puVar17 = puVar17 + 1;
                    } while (*puVar14 == uVar30);
                  }
                }
                else {
LAB_00461f03:
                  if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar14 = (ulong *)((long)puVar14 + 4);
                  }
                  if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar14 = (ulong *)((long)puVar14 + 2);
                  }
                  if (puVar17 < puVar4) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                  }
                  pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                }
              }
              else {
                pBVar23 = (BYTE *)0x0;
              }
              if ((pBVar18 < pBVar23) &&
                 (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                 (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                bVar10 = false;
              }
              else {
                pBVar23 = pBVar18;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar35 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar27 < uVar11)) &&
                    (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
          }
          else if (uVar27 == 5) {
            pUVar8 = ms->chainTable;
            uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar38 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar22 = iVar16 - (int)pBVar38;
            uVar12 = uVar22 - uVar35;
            if (uVar22 < uVar35) {
              uVar12 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,5);
            if (uVar27 < uVar11) {
              iVar16 = 1 << ((byte)uVar7 & 0x1f);
              uVar25 = 999999999;
              pBVar18 = (BYTE *)0x3;
              do {
                puVar14 = (ulong *)(pBVar38 + uVar11);
                if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                  puVar17 = puVar26;
                  if (puVar26 < puVar1) {
                    uVar28 = *puVar26 ^ *puVar14;
                    uVar30 = 0;
                    if (uVar28 != 0) {
                      for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                      }
                    }
                    pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                    puVar17 = (ulong *)((long)puVar19 + 10);
                    if (*puVar14 == *puVar26) {
                      do {
                        puVar14 = puVar14 + 1;
                        if (puVar1 <= puVar17) goto LAB_004620b0;
                        uVar30 = *puVar17;
                        uVar31 = uVar30 ^ *puVar14;
                        uVar28 = 0;
                        if (uVar31 != 0) {
                          for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                          }
                        }
                        pBVar23 = (BYTE *)((long)puVar17 +
                                          ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                        puVar17 = puVar17 + 1;
                      } while (*puVar14 == uVar30);
                    }
                  }
                  else {
LAB_004620b0:
                    if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 4);
                      puVar14 = (ulong *)((long)puVar14 + 4);
                    }
                    if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                      puVar17 = (ulong *)((long)puVar17 + 2);
                      puVar14 = (ulong *)((long)puVar14 + 2);
                    }
                    if (puVar17 < puVar4) {
                      puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17))
                      ;
                    }
                    pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                  }
                }
                else {
                  pBVar23 = (BYTE *)0x0;
                }
                if ((pBVar18 < pBVar23) &&
                   (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                   (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                  bVar10 = false;
                }
                else {
                  pBVar23 = pBVar18;
                  if (uVar12 < uVar11) {
                    uVar11 = pUVar8[uVar11 & uVar35 - 1];
                    bVar10 = true;
                  }
                  else {
                    bVar10 = false;
                  }
                }
              } while (((bVar10) && (uVar27 < uVar11)) &&
                      (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
            }
            else {
LAB_004622eb:
              pBVar23 = (BYTE *)0x3;
              uVar25 = 999999999;
            }
          }
          else {
            pUVar8 = ms->chainTable;
            uVar35 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
            pBVar38 = (ms->window).base;
            uVar27 = (ms->window).lowLimit;
            uVar22 = iVar16 - (int)pBVar38;
            uVar12 = uVar22 - uVar35;
            if (uVar22 < uVar35) {
              uVar12 = 0;
            }
            uVar7 = (ms->cParams).searchLog;
            uVar11 = ZSTD_insertAndFindFirstIndex_internal(ms,cParams_00,(BYTE *)puVar26,4);
            if (uVar11 <= uVar27) goto LAB_004622eb;
            iVar16 = 1 << ((byte)uVar7 & 0x1f);
            uVar25 = 999999999;
            pBVar18 = (BYTE *)0x3;
            do {
              puVar14 = (ulong *)(pBVar38 + uVar11);
              if (pBVar18[(long)puVar14] == *(BYTE *)((long)puVar26 + (long)pBVar18)) {
                puVar17 = puVar26;
                if (puVar26 < puVar1) {
                  uVar28 = *puVar26 ^ *puVar14;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)(uVar30 >> 3 & 0x1fffffff);
                  puVar17 = (ulong *)((long)puVar19 + 10);
                  if (*puVar14 == *puVar26) {
                    do {
                      puVar14 = puVar14 + 1;
                      if (puVar1 <= puVar17) goto LAB_00462254;
                      uVar30 = *puVar17;
                      uVar31 = uVar30 ^ *puVar14;
                      uVar28 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                        }
                      }
                      pBVar23 = (BYTE *)((long)puVar17 +
                                        ((uVar28 >> 3 & 0x1fffffff) - (long)puVar26));
                      puVar17 = puVar17 + 1;
                    } while (*puVar14 == uVar30);
                  }
                }
                else {
LAB_00462254:
                  if ((puVar17 < puVar2) && ((int)*puVar14 == (int)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 4);
                    puVar14 = (ulong *)((long)puVar14 + 4);
                  }
                  if ((puVar17 < puVar3) && ((short)*puVar14 == (short)*puVar17)) {
                    puVar17 = (ulong *)((long)puVar17 + 2);
                    puVar14 = (ulong *)((long)puVar14 + 2);
                  }
                  if (puVar17 < puVar4) {
                    puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar14 == (BYTE)*puVar17));
                  }
                  pBVar23 = (BYTE *)((long)puVar17 - (long)puVar26);
                }
              }
              else {
                pBVar23 = (BYTE *)0x0;
              }
              if ((pBVar18 < pBVar23) &&
                 (uVar25 = (ulong)((uVar22 + 2) - uVar11), pBVar18 = pBVar23,
                 (ulong *)((long)puVar26 + (long)pBVar23) == puVar4)) {
                bVar10 = false;
              }
              else {
                pBVar23 = pBVar18;
                if (uVar12 < uVar11) {
                  uVar11 = pUVar8[uVar11 & uVar35 - 1];
                  bVar10 = true;
                }
                else {
                  bVar10 = false;
                }
              }
            } while (((bVar10) && (uVar27 < uVar11)) &&
                    (iVar16 = iVar16 + -1, pBVar18 = pBVar23, iVar16 != 0));
          }
          bVar10 = true;
          if ((BYTE *)0x3 < pBVar23) {
            uVar12 = (int)uVar37 + 1;
            uVar27 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            uVar12 = (int)uVar25 + 1;
            iVar16 = 0x1f;
            if (uVar12 != 0) {
              for (; uVar12 >> iVar16 == 0; iVar16 = iVar16 + -1) {
              }
            }
            if ((int)((uVar27 ^ 0x1f) + (int)local_a0 * 4 + -0x18) < (int)pBVar23 * 4 - iVar16) {
              bVar10 = false;
              puVar39 = puVar26;
              uVar37 = uVar25;
              local_a0 = pBVar23;
            }
          }
        } while (!bVar10);
LAB_0046236d:
        if (uVar37 == 0) {
          UVar36 = 1;
          uVar37 = uVar13;
        }
        else {
          if ((src < puVar39) && (pBVar33 < (BYTE *)((long)puVar39 + (2 - uVar37)))) {
            puVar26 = puVar39;
            while (puVar39 = puVar26,
                  *(BYTE *)((long)puVar26 + -1) == *(BYTE *)((long)puVar26 + (1 - uVar37))) {
              puVar39 = (ulong *)((long)puVar26 + -1);
              local_a0 = local_a0 + 1;
              if ((puVar39 <= src) ||
                 (pBVar38 = (BYTE *)((long)puVar26 + (1 - uVar37)), puVar26 = puVar39,
                 pBVar38 <= pBVar33)) break;
            }
          }
          UVar36 = (int)uVar37 + 1;
          uVar37 = (ulong)((int)uVar37 - 2);
          uVar29 = uVar13;
        }
        uVar13 = (long)puVar39 - (long)src;
        puVar19 = (ulong *)seqStore->lit;
        puVar26 = (ulong *)((long)puVar19 + uVar13);
        do {
          *puVar19 = *src;
          puVar19 = puVar19 + 1;
          src = (void *)((long)src + 8);
        } while (puVar19 < puVar26);
        seqStore->lit = seqStore->lit + uVar13;
        if (0xffff < uVar13) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9 = seqStore->sequences;
        psVar9->litLength = (U16)uVar13;
        psVar9->offset = UVar36;
        if ((BYTE *)0xffff < local_a0 + -3) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar9->matchLength = (U16)(local_a0 + -3);
        seqStore->sequences = psVar9 + 1;
        src = (void *)((long)puVar39 + (long)local_a0);
        uVar13 = uVar37;
        puVar39 = (ulong *)src;
        if (((int)uVar29 != 0) && (src <= puVar32)) {
          while (uVar25 = uVar37, uVar37 = uVar29, uVar13 = uVar25, uVar29 = uVar37,
                puVar39 = (ulong *)src, (int)*src == *(int *)((long)src - uVar37)) {
            puVar39 = (ulong *)((long)src + 4);
            puVar19 = (ulong *)((long)src + (4 - uVar37));
            puVar26 = puVar39;
            if (puVar39 < puVar1) {
              uVar13 = *puVar39 ^ *puVar19;
              uVar29 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                }
              }
              pBVar38 = (BYTE *)(uVar29 >> 3 & 0x1fffffff);
              if (*puVar19 == *puVar39) {
                puVar26 = (ulong *)((long)src + 0xc);
                puVar19 = (ulong *)((long)src + (0xc - uVar37));
                do {
                  if (puVar1 <= puVar26) goto LAB_00462515;
                  uVar29 = *puVar19;
                  uVar13 = *puVar26;
                  uVar28 = uVar13 ^ uVar29;
                  uVar30 = 0;
                  if (uVar28 != 0) {
                    for (; (uVar28 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  pBVar38 = (BYTE *)((long)puVar26 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar39));
                  puVar26 = puVar26 + 1;
                  puVar19 = puVar19 + 1;
                } while (uVar29 == uVar13);
              }
            }
            else {
LAB_00462515:
              if ((puVar26 < puVar2) && ((int)*puVar19 == (int)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar26 < puVar3) && ((short)*puVar19 == (short)*puVar26)) {
                puVar26 = (ulong *)((long)puVar26 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar26 < puVar4) {
                puVar26 = (ulong *)((long)puVar26 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar26));
              }
              pBVar38 = (BYTE *)((long)puVar26 - (long)puVar39);
            }
            *(ulong *)seqStore->lit = *src;
            psVar9 = seqStore->sequences;
            psVar9->litLength = 0;
            psVar9->offset = 1;
            if ((BYTE *)0xffff < pBVar38 + 1) {
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar9->matchLength = (U16)(pBVar38 + 1);
            seqStore->sequences = psVar9 + 1;
            src = (void *)((long)src + (long)(pBVar38 + 4));
            uVar13 = uVar37;
            uVar29 = uVar25;
            puVar39 = (ulong *)src;
            if (((int)uVar25 == 0) || (puVar32 < src)) break;
          }
        }
      }
      uVar27 = (uint)uVar29;
      uVar12 = (uint)uVar13;
    } while (puVar39 < puVar32);
  }
  uVar22 = 0;
  if (uVar20 < uVar5) {
    uVar22 = uVar5;
  }
  if (uVar20 < uVar6) {
    uVar22 = uVar6;
  }
  if (uVar12 == 0) {
    uVar12 = uVar22;
  }
  if (uVar27 != 0) {
    uVar22 = uVar27;
  }
  *rep = uVar12;
  rep[1] = uVar22;
  return (long)puVar4 - (long)src;
}

Assistant:

FORCE_INLINE_TEMPLATE
size_t ZSTD_compressBlock_lazy_generic(
                        ZSTD_matchState_t* ms, seqStore_t* seqStore,
                        U32 rep[ZSTD_REP_NUM],
                        const void* src, size_t srcSize,
                        const U32 searchMethod, const U32 depth,
                        ZSTD_dictMode_e const dictMode)
{
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32 prefixLowestIndex = ms->window.dictLimit;
    const BYTE* const prefixLowest = base + prefixLowestIndex;

    typedef size_t (*searchMax_f)(
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* iLimit, size_t* offsetPtr);
    searchMax_f const searchMax = dictMode == ZSTD_dictMatchState ?
        (searchMethod ? ZSTD_BtFindBestMatch_dictMatchState_selectMLS : ZSTD_HcFindBestMatch_dictMatchState_selectMLS) :
        (searchMethod ? ZSTD_BtFindBestMatch_selectMLS : ZSTD_HcFindBestMatch_selectMLS);
    U32 offset_1 = rep[0], offset_2 = rep[1], savedOffset=0;

    const ZSTD_matchState_t* const dms = ms->dictMatchState;
    const U32 dictLowestIndex      = dictMode == ZSTD_dictMatchState ?
                                     dms->window.dictLimit : 0;
    const BYTE* const dictBase     = dictMode == ZSTD_dictMatchState ?
                                     dms->window.base : NULL;
    const BYTE* const dictLowest   = dictMode == ZSTD_dictMatchState ?
                                     dictBase + dictLowestIndex : NULL;
    const BYTE* const dictEnd      = dictMode == ZSTD_dictMatchState ?
                                     dms->window.nextSrc : NULL;
    const U32 dictIndexDelta       = dictMode == ZSTD_dictMatchState ?
                                     prefixLowestIndex - (U32)(dictEnd - dictBase) :
                                     0;
    const U32 dictAndPrefixLength = (U32)(ip - prefixLowest + dictEnd - dictLowest);

    /* init */
    ip += (dictAndPrefixLength == 0);
    ms->nextToUpdate3 = ms->nextToUpdate;
    if (dictMode == ZSTD_noDict) {
        U32 const maxRep = (U32)(ip - prefixLowest);
        if (offset_2 > maxRep) savedOffset = offset_2, offset_2 = 0;
        if (offset_1 > maxRep) savedOffset = offset_1, offset_1 = 0;
    }
    if (dictMode == ZSTD_dictMatchState) {
        /* dictMatchState repCode checks don't currently handle repCode == 0
         * disabling. */
        assert(offset_1 <= dictAndPrefixLength);
        assert(offset_2 <= dictAndPrefixLength);
    }

    /* Match Loop */
    while (ip < ilimit) {
        size_t matchLength=0;
        size_t offset=0;
        const BYTE* start=ip+1;

        /* check repCode */
        if (dictMode == ZSTD_dictMatchState) {
            const U32 repIndex = (U32)(ip - base) + 1 - offset_1;
            const BYTE* repMatch = (dictMode == ZSTD_dictMatchState
                                && repIndex < prefixLowestIndex) ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
            if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
                const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                matchLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                if (depth==0) goto _storeSequence;
            }
        }
        if ( dictMode == ZSTD_noDict
          && ((offset_1 > 0) & (MEM_read32(ip+1-offset_1) == MEM_read32(ip+1)))) {
            matchLength = ZSTD_count(ip+1+4, ip+1+4-offset_1, iend) + 4;
            if (depth==0) goto _storeSequence;
        }

        /* first search (depth 0) */
        {   size_t offsetFound = 999999999;
            size_t const ml2 = searchMax(ms, ip, iend, &offsetFound);
            if (ml2 > matchLength)
                matchLength = ml2, start = ip, offset=offsetFound;
        }

        if (matchLength < 4) {
            ip += ((ip-anchor) >> kSearchStrength) + 1;   /* jump faster over incompressible sections */
            continue;
        }

        /* let's try to find a better solution */
        if (depth>=1)
        while (ip<ilimit) {
            ip ++;
            if ( (dictMode == ZSTD_noDict)
              && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                int const gain2 = (int)(mlRep * 3);
                int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                if ((mlRep >= 4) && (gain2 > gain1))
                    matchLength = mlRep, offset = 0, start = ip;
            }
            if (dictMode == ZSTD_dictMatchState) {
                const U32 repIndex = (U32)(ip - base) - offset_1;
                const BYTE* repMatch = repIndex < prefixLowestIndex ?
                               dictBase + (repIndex - dictIndexDelta) :
                               base + repIndex;
                if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                    && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                    size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                    int const gain2 = (int)(mlRep * 3);
                    int const gain1 = (int)(matchLength*3 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
            }
            {   size_t offset2=999999999;
                size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 4);
                if ((ml2 >= 4) && (gain2 > gain1)) {
                    matchLength = ml2, offset = offset2, start = ip;
                    continue;   /* search a better one */
            }   }

            /* let's find an even better one */
            if ((depth==2) && (ip<ilimit)) {
                ip ++;
                if ( (dictMode == ZSTD_noDict)
                  && (offset) && ((offset_1>0) & (MEM_read32(ip) == MEM_read32(ip - offset_1)))) {
                    size_t const mlRep = ZSTD_count(ip+4, ip+4-offset_1, iend) + 4;
                    int const gain2 = (int)(mlRep * 4);
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                    if ((mlRep >= 4) && (gain2 > gain1))
                        matchLength = mlRep, offset = 0, start = ip;
                }
                if (dictMode == ZSTD_dictMatchState) {
                    const U32 repIndex = (U32)(ip - base) - offset_1;
                    const BYTE* repMatch = repIndex < prefixLowestIndex ?
                                   dictBase + (repIndex - dictIndexDelta) :
                                   base + repIndex;
                    if (((U32)((prefixLowestIndex-1) - repIndex) >= 3 /* intentional underflow */)
                        && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                        const BYTE* repMatchEnd = repIndex < prefixLowestIndex ? dictEnd : iend;
                        size_t const mlRep = ZSTD_count_2segments(ip+4, repMatch+4, iend, repMatchEnd, prefixLowest) + 4;
                        int const gain2 = (int)(mlRep * 4);
                        int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 1);
                        if ((mlRep >= 4) && (gain2 > gain1))
                            matchLength = mlRep, offset = 0, start = ip;
                    }
                }
                {   size_t offset2=999999999;
                    size_t const ml2 = searchMax(ms, ip, iend, &offset2);
                    int const gain2 = (int)(ml2*4 - ZSTD_highbit32((U32)offset2+1));   /* raw approx */
                    int const gain1 = (int)(matchLength*4 - ZSTD_highbit32((U32)offset+1) + 7);
                    if ((ml2 >= 4) && (gain2 > gain1)) {
                        matchLength = ml2, offset = offset2, start = ip;
                        continue;
            }   }   }
            break;  /* nothing found : store previous solution */
        }

        /* NOTE:
         * start[-offset+ZSTD_REP_MOVE-1] is undefined behavior.
         * (-offset+ZSTD_REP_MOVE-1) is unsigned, and is added to start, which
         * overflows the pointer, which is undefined behavior.
         */
        /* catch up */
        if (offset) {
            if (dictMode == ZSTD_noDict) {
                while ( ((start > anchor) & (start - (offset-ZSTD_REP_MOVE) > prefixLowest))
                     && (start[-1] == (start-(offset-ZSTD_REP_MOVE))[-1]) )  /* only search for offset within prefix */
                    { start--; matchLength++; }
            }
            if (dictMode == ZSTD_dictMatchState) {
                U32 const matchIndex = (U32)((start-base) - (offset - ZSTD_REP_MOVE));
                const BYTE* match = (matchIndex < prefixLowestIndex) ? dictBase + matchIndex - dictIndexDelta : base + matchIndex;
                const BYTE* const mStart = (matchIndex < prefixLowestIndex) ? dictLowest : prefixLowest;
                while ((start>anchor) && (match>mStart) && (start[-1] == match[-1])) { start--; match--; matchLength++; }  /* catch up */
            }
            offset_2 = offset_1; offset_1 = (U32)(offset - ZSTD_REP_MOVE);
        }
        /* store sequence */
_storeSequence:
        {   size_t const litLength = start - anchor;
            ZSTD_storeSeq(seqStore, litLength, anchor, (U32)offset, matchLength-MINMATCH);
            anchor = ip = start + matchLength;
        }

        /* check immediate repcode */
        if (dictMode == ZSTD_dictMatchState) {
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex = current2 - offset_2;
                const BYTE* repMatch = dictMode == ZSTD_dictMatchState
                    && repIndex < prefixLowestIndex ?
                        dictBase - dictIndexDelta + repIndex :
                        base + repIndex;
                if ( ((U32)((prefixLowestIndex-1) - (U32)repIndex) >= 3 /* intentional overflow */)
                   && (MEM_read32(repMatch) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex < prefixLowestIndex ? dictEnd : iend;
                    matchLength = ZSTD_count_2segments(ip+4, repMatch+4, iend, repEnd2, prefixLowest) + 4;
                    offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, 0, matchLength-MINMATCH);
                    ip += matchLength;
                    anchor = ip;
                    continue;
                }
                break;
            }
        }

        if (dictMode == ZSTD_noDict) {
            while ( ((ip <= ilimit) & (offset_2>0))
                 && (MEM_read32(ip) == MEM_read32(ip - offset_2)) ) {
                /* store sequence */
                matchLength = ZSTD_count(ip+4, ip+4-offset_2, iend) + 4;
                offset = offset_2; offset_2 = offset_1; offset_1 = (U32)offset; /* swap repcodes */
                ZSTD_storeSeq(seqStore, 0, anchor, 0, matchLength-MINMATCH);
                ip += matchLength;
                anchor = ip;
                continue;   /* faster when present ... (?) */
    }   }   }

    /* Save reps for next block */
    rep[0] = offset_1 ? offset_1 : savedOffset;
    rep[1] = offset_2 ? offset_2 : savedOffset;

    /* Return the last literals size */
    return iend - anchor;
}